

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
          (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *this,Part *t)

{
  qsizetype *pqVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paVar2;
  undefined1 *__src;
  void *pvVar3;
  undefined1 auVar4 [16];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  size_t allocSize;
  size_t sVar6;
  QVLAStorage<24UL,_8UL,_32LL> *__dest;
  long lVar7;
  size_t totalCapacity;
  ulong uVar8;
  ulong uVar9;
  
  lVar7 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  if (lVar7 == (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a) {
    uVar9 = lVar7 * 2;
    uVar8 = lVar7 + 1;
    if (uVar9 - uVar8 != 0 && (long)uVar8 <= (long)uVar9) {
      uVar8 = uVar9;
    }
    __src = (undefined1 *)(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr
    ;
    __dest = &this->super_QVLAStorage<24UL,_8UL,_32LL>;
    uVar9 = 0x20;
    if (0x20 < (long)uVar8) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar8;
      allocSize = SUB168(auVar4 * ZEXT816(0x18),0);
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
LAB_00333ad0:
        qBadAlloc();
      }
      sVar6 = QtPrivate::expectedAllocSize(allocSize,0x10);
      if (sVar6 != 0) {
        if (sVar6 < 0x18) goto LAB_00333ad0;
        uVar8 = sVar6 / 0x18;
        allocSize = uVar8 * 0x18;
      }
      __dest = (QVLAStorage<24UL,_8UL,_32LL> *)malloc(allocSize);
      uVar9 = uVar8;
      if (__dest == (QVLAStorage<24UL,_8UL,_32LL> *)0x0) goto LAB_00333ad0;
    }
    if (lVar7 != 0) {
      memcpy(__dest,__src,lVar7 * 0x18);
    }
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr = __dest;
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a = uVar9;
    if (((QVLAStorage<24UL,_8UL,_32LL> *)__src != &this->super_QVLAStorage<24UL,_8UL,_32LL>) &&
       ((QVLAStorage<24UL,_8UL,_32LL> *)__src != __dest)) {
      QtPrivate::sizedFree(__src,lVar7 * 0x18);
      lVar7 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
    }
  }
  pvVar3 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr;
  *(undefined8 *)((long)pvVar3 + lVar7 * 0x18 + 0x10) = *(undefined8 *)&t->number;
  aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(t->string).m_size;
  paVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((long)pvVar3 + lVar7 * 0x18);
  *paVar2 = (t->string).field_0;
  paVar2[1] = aVar5;
  pqVar1 = &(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  *pqVar1 = *pqVar1 + 1;
  return;
}

Assistant:

void push_back(T &&t) { append(std::move(t)); }